

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_smooth_effects(DUMB_IT_SIGRENDERER *sigrenderer)

{
  long in_RDI;
  IT_PLAYING *playing_1;
  IT_PLAYING *playing;
  IT_CHANNEL *channel;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    if (*(long *)(in_RDI + (long)local_c * 0xa0 + 0xa8) != 0) {
      update_smooth_effects_playing((IT_PLAYING *)0x85ad18);
    }
  }
  for (local_c = 0; local_c < 0xc0; local_c = local_c + 1) {
    if (*(long *)(in_RDI + 0x2820 + (long)local_c * 8) != 0) {
      update_smooth_effects_playing((IT_PLAYING *)0x85ad5f);
    }
  }
  return;
}

Assistant:

static void update_smooth_effects(DUMB_IT_SIGRENDERER *sigrenderer)
{
	int i;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
		IT_PLAYING *playing = channel->playing;

		if (playing) {
			update_smooth_effects_playing(playing);
		}
	}

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
		IT_PLAYING *playing = sigrenderer->playing[i];

		if (playing) {
			update_smooth_effects_playing(playing);
		}
	}
}